

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

IVec3 __thiscall
tcu::anon_unknown_3::convertRGB8ToNativeFormat
          (anon_unknown_3 *this,RGBA *color,RasterizationArguments *args)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  int channelNdx;
  long lVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  IVec3 IVar9;
  
  IVar9.m_data[2] = (int)args;
  *(undefined4 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  uVar1 = color->m_value;
  lVar4 = 0;
  do {
    sVar5 = (lVar4 != 1) * '\b' + 8;
    lVar8 = (ulong)(lVar4 != 1) * 4 + 0xc;
    if (lVar4 == 0) {
      lVar8 = 8;
      sVar5 = 0;
    }
    iVar2 = *(int *)((long)&args->numSamples + lVar8);
    uVar6 = uVar1 >> sVar5 & 0xff;
    cVar3 = (char)iVar2;
    uVar7 = uVar6 >> (8U - cVar3 & 0x1f);
    if (8 < iVar2) {
      uVar7 = uVar6 << (cVar3 - 8U & 0x1f);
    }
    *(uint *)(this + lVar4 * 4) = uVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  IVar9.m_data._0_8_ = this;
  return (IVec3)IVar9.m_data;
}

Assistant:

tcu::IVec3 convertRGB8ToNativeFormat (const tcu::RGBA& color, const RasterizationArguments& args)
{
	tcu::IVec3 pixelNativeColor;

	for (int channelNdx = 0; channelNdx < 3; ++channelNdx)
	{
		const int channelBitCount	= (channelNdx == 0) ? (args.redBits) : (channelNdx == 1) ? (args.greenBits) : (args.blueBits);
		const int channelPixelValue	= (channelNdx == 0) ? (color.getRed()) : (channelNdx == 1) ? (color.getGreen()) : (color.getBlue());

		if (channelBitCount <= 8)
			pixelNativeColor[channelNdx] = channelPixelValue >> (8 - channelBitCount);
		else if (channelBitCount == 8)
			pixelNativeColor[channelNdx] = channelPixelValue;
		else
		{
			// just in case someone comes up with 8+ bits framebuffers pixel formats. But as
			// we can only read in rgba8, we have to guess the trailing bits. Guessing 0.
			pixelNativeColor[channelNdx] = channelPixelValue << (channelBitCount - 8);
		}
	}

	return pixelNativeColor;
}